

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QWidgetPrivate::reparentWidgetWindowChildren(QWidgetPrivate *this,QWidget *parentWithWindow)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = *(long *)&this->field_0x28;
  if (lVar1 != 0) {
    lVar2 = *(long *)&this->field_0x20;
    lVar4 = 0;
    do {
      lVar3 = *(long *)(lVar2 + lVar4);
      if ((lVar3 != 0) && (((*(QWidgetPrivate **)(lVar3 + 8))->field_0x30 & 1) != 0)) {
        reparentWidgetWindows
                  (*(QWidgetPrivate **)(lVar3 + 8),parentWithWindow,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)
                   ((QFlagsStorageHelper<Qt::WindowType,_4> *)(*(long *)(lVar3 + 0x20) + 0xc))->
                   super_QFlagsStorage<Qt::WindowType>);
      }
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  return;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }